

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O3

int __thiscall
ncnn::Spectrogram::forward(Spectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  double dVar4;
  uint _c;
  Mat *pMVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint _h;
  long lVar9;
  long lVar10;
  int iVar11;
  size_t sVar12;
  long lVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float *local_168;
  ulong local_150;
  float norm;
  float local_120;
  float local_11c;
  Mat *local_118;
  Mat local_110;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  void *local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  double local_88;
  double local_80;
  Option opt_b;
  
  local_110.data = bottom_blob->data;
  local_110.refcount = bottom_blob->refcount;
  local_110.elemsize = bottom_blob->elemsize;
  local_110.elempack = bottom_blob->elempack;
  local_110.allocator = bottom_blob->allocator;
  local_110.dims = bottom_blob->dims;
  local_110.w = bottom_blob->w;
  local_110.h = bottom_blob->h;
  local_110.d = bottom_blob->d;
  local_110.c = bottom_blob->c;
  local_110.cstep = bottom_blob->cstep;
  if (local_110.refcount != (int *)0x0) {
    LOCK();
    *local_110.refcount = *local_110.refcount + 1;
    UNLOCK();
  }
  if (this->center == 1) {
    opt_b.lightmode = opt->lightmode;
    opt_b.use_shader_pack8 = opt->use_shader_pack8;
    opt_b.use_subgroup_ops = opt->use_subgroup_ops;
    opt_b.use_reserved_0 = opt->use_reserved_0;
    opt_b.num_threads = opt->num_threads;
    opt_b.workspace_allocator = opt->workspace_allocator;
    opt_b.openmp_blocktime = opt->openmp_blocktime;
    opt_b.use_winograd_convolution = opt->use_winograd_convolution;
    opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_b.use_int8_inference = opt->use_int8_inference;
    opt_b.use_vulkan_compute = opt->use_vulkan_compute;
    opt_b.use_bf16_storage = opt->use_bf16_storage;
    opt_b.use_fp16_packed = opt->use_fp16_packed;
    opt_b.use_fp16_storage = opt->use_fp16_storage;
    opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_b.use_int8_packed = opt->use_int8_packed;
    opt_b.use_int8_storage = opt->use_int8_storage;
    opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_b.use_packing_layout = opt->use_packing_layout;
    opt_b.vulkan_device_index = opt->vulkan_device_index;
    opt_b.use_reserved_1 = opt->use_reserved_1;
    opt_b.use_image_storage = opt->use_image_storage;
    opt_b.use_tensor_storage = opt->use_tensor_storage;
    opt_b.use_reserved_2 = opt->use_reserved_2;
    opt_b.flush_denormals = opt->flush_denormals;
    opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_b.use_shader_local_memory = opt->use_shader_local_memory;
    opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_b.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_b.use_fp16_uniform = opt->use_fp16_uniform;
    opt_b.use_int8_uniform = opt->use_int8_uniform;
    opt_b.use_reserved_9 = opt->use_reserved_9;
    opt_b.use_reserved_10 = opt->use_reserved_10;
    opt_b.use_reserved_11 = opt->use_reserved_11;
    opt_b.blob_allocator = opt->workspace_allocator;
    iVar14 = this->pad_type;
    if (iVar14 == 0) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_110,0,0,iVar14,iVar14,0,0.0,&opt_b);
      iVar14 = this->pad_type;
    }
    if (iVar14 == 1) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_110,0,0,iVar14,iVar14,1,0.0,&opt_b);
      iVar14 = this->pad_type;
    }
    if (iVar14 == 2) {
      iVar14 = this->n_fft / 2;
      copy_make_border(bottom_blob,&local_110,0,0,iVar14,iVar14,2,0.0,&opt_b);
    }
  }
  uVar1 = this->n_fft;
  iVar14 = (int)(local_110.w - uVar1) / this->hoplen;
  _h = iVar14 + 1;
  local_c0 = (ulong)_h;
  uVar17 = (ulong)(uint)((int)uVar1 / 2);
  uVar7 = (int)uVar1 / 2 + 1;
  _c = uVar7;
  if (this->onesided == 0) {
    _c = uVar1;
  }
  if (this->power == 0) {
    Mat::create(top_blob,2,_h,_c,local_110.elemsize,opt->blob_allocator);
  }
  else {
    Mat::create(top_blob,_h,_c,local_110.elemsize,opt->blob_allocator);
  }
  local_a8 = top_blob->data;
  iVar11 = -100;
  if ((local_a8 != (void *)0x0) && (local_c8 = uVar17, (long)top_blob->c * top_blob->cstep != 0)) {
    local_118 = top_blob;
    if (-2 < (int)uVar1) {
      local_b0 = local_110.data;
      uVar1 = this->n_fft;
      iVar11 = this->power;
      iVar2 = this->normalized;
      local_98 = (long)(int)uVar1;
      fVar20 = (float)(1.0 / SQRT((double)(int)uVar1));
      local_a0 = (ulong)uVar7;
      sVar12 = (long)top_blob->w;
      if (iVar11 == 0) {
        sVar12 = top_blob->cstep;
      }
      local_b8 = sVar12 * top_blob->elemsize;
      dVar22 = 1.0 / (double)(int)uVar1;
      local_90 = (long)this->hoplen << 2;
      local_150 = 0;
      local_88 = dVar22;
      do {
        if (-1 < iVar14) {
          local_168 = (float *)(local_b8 * local_150 + (long)local_a8);
          pvVar3 = (this->window_data).data;
          dVar4 = (double)(int)local_150 * 6.283185307179586;
          pvVar15 = local_b0;
          local_80 = dVar4;
          iVar6 = 0;
          do {
            if ((int)uVar1 < 1) {
              fVar23 = 0.0;
              fVar21 = 0.0;
            }
            else {
              fVar21 = 0.0;
              uVar17 = 0;
              fVar23 = 0.0;
              do {
                fVar19 = *(float *)((long)pvVar3 + uVar17 * 4) *
                         *(float *)((long)pvVar15 + uVar17 * 4);
                sincosf((float)((double)(int)uVar17 * dVar4 * dVar22),&local_11c,&local_120);
                fVar23 = fVar23 + local_120 * fVar19;
                fVar21 = fVar21 - fVar19 * local_11c;
                uVar17 = uVar17 + 1;
                dVar22 = local_88;
                dVar4 = local_80;
              } while (uVar1 != uVar17);
            }
            if (iVar2 == 1) {
              fVar23 = fVar23 * fVar20;
              fVar21 = fVar21 * fVar20;
            }
            else if (iVar2 == 2) {
              fVar19 = *(float *)((long)pvVar3 + local_98 * 4);
              fVar23 = fVar23 * fVar19;
              fVar21 = fVar21 * fVar19;
            }
            if (iVar11 == 2) {
              *local_168 = fVar21 * fVar21 + fVar23 * fVar23;
LAB_0059f04b:
              local_168 = local_168 + 1;
            }
            else {
              if (iVar11 == 1) {
                *local_168 = SQRT(fVar21 * fVar21 + fVar23 * fVar23);
                goto LAB_0059f04b;
              }
              if (iVar11 == 0) {
                *local_168 = fVar23;
                local_168[1] = fVar21;
                local_168 = local_168 + 2;
              }
            }
            pvVar15 = (void *)((long)pvVar15 + local_90);
            bVar18 = iVar6 != iVar14;
            iVar6 = iVar6 + 1;
          } while (bVar18);
        }
        local_150 = local_150 + 1;
      } while (local_150 != local_a0);
    }
    pMVar5 = local_118;
    iVar11 = 0;
    if ((this->onesided == 0) &&
       (uVar17 = (ulong)(uint)this->n_fft, iVar11 = 0, (int)uVar7 < this->n_fft)) {
      iVar11 = (int)local_c0;
      lVar10 = (long)(int)uVar7;
      uVar16 = ~(long)(int)local_c8;
      do {
        if (this->power == 0) {
          if (-1 < iVar14) {
            pvVar3 = pMVar5->data;
            lVar8 = pMVar5->cstep * pMVar5->elemsize;
            lVar13 = ((long)(int)uVar17 + uVar16) * lVar8;
            lVar8 = lVar8 * lVar10;
            lVar9 = 0;
            do {
              *(undefined4 *)((long)pvVar3 + lVar9 * 8 + lVar8) =
                   *(undefined4 *)((long)pvVar3 + lVar9 * 8 + lVar13);
              *(uint *)((long)pvVar3 + lVar9 * 8 + lVar8 + 4) =
                   *(uint *)((long)pvVar3 + lVar9 * 8 + lVar13 + 4) ^ 0x80000000;
              lVar9 = lVar9 + 1;
            } while (iVar11 != (int)lVar9);
          }
        }
        else {
          lVar13 = (long)pMVar5->w * pMVar5->elemsize;
          memcpy((void *)(lVar13 * lVar10 + (long)pMVar5->data),
                 (void *)(((int)uVar17 - lVar10) * lVar13 + (long)pMVar5->data),(long)iVar11 << 2);
        }
        lVar10 = lVar10 + 1;
        uVar17 = (ulong)this->n_fft;
        uVar16 = uVar16 - 1;
      } while (lVar10 < (long)uVar17);
      iVar11 = 0;
    }
  }
  if (local_110.refcount != (int *)0x0) {
    LOCK();
    *local_110.refcount = *local_110.refcount + -1;
    UNLOCK();
    if (*local_110.refcount == 0) {
      if (local_110.allocator == (Allocator *)0x0) {
        if (local_110.data != (void *)0x0) {
          free(local_110.data);
        }
      }
      else {
        (*(local_110.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int Spectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://pytorch.org/audio/stable/generated/torchaudio.functional.spectrogram.html

    // TODO custom window

    Mat bottom_blob_bordered = bottom_blob;
    if (center == 1)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        if (pad_type == 0)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_CONSTANT, 0.f, opt_b);
        if (pad_type == 1)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REPLICATE, 0.f, opt_b);
        if (pad_type == 2)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REFLECT, 0.f, opt_b);
    }

    const int size = bottom_blob_bordered.w;

    // const int frames = size / hoplen + 1;
    const int frames = (size - n_fft) / hoplen + 1;
    const int freqs_onesided = n_fft / 2 + 1;
    const int freqs = onesided ? freqs_onesided : n_fft;

    const size_t elemsize = bottom_blob_bordered.elemsize;

    if (power == 0)
    {
        top_blob.create(2, frames, freqs, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(frames, freqs, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < freqs_onesided; i++)
    {
        const float* ptr = bottom_blob_bordered;
        float* outptr = power == 0 ? top_blob.channel(i) : top_blob.row(i);

        for (int j = 0; j < frames; j++)
        {
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                float v = ptr[k];

                // apply window
                v *= window_data[k];

                // dft
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += v * cosf(angle); // + imag * sinf(angle);
                im -= v * sinf(angle); // + imag * cosf(angle);
            }

            if (normalized == 1)
            {
                float norm = 1.f / sqrt(n_fft);
                re *= norm;
                im *= norm;
            }
            if (normalized == 2)
            {
                float norm = window_data[n_fft];
                re *= norm;
                im *= norm;
            }

            if (power == 0)
            {
                // complex as real
                outptr[0] = re;
                outptr[1] = im;
                outptr += 2;
            }
            if (power == 1)
            {
                // magnitude
                outptr[0] = sqrt(re * re + im * im);
                outptr += 1;
            }
            if (power == 2)
            {
                outptr[0] = re * re + im * im;
                outptr += 1;
            }

            ptr += hoplen;
        }
    }

    if (!onesided)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = freqs_onesided; i < n_fft; i++)
        {
            if (power == 0)
            {
                const float* ptr = top_blob.channel(n_fft - i);
                float* outptr = top_blob.channel(i);

                for (int j = 0; j < frames; j++)
                {
                    // complex as real
                    outptr[0] = ptr[0];
                    outptr[1] = -ptr[1];
                    ptr += 2;
                    outptr += 2;
                }
            }
            else // if (power == 1 || power == 2)
            {
                const float* ptr = top_blob.row(n_fft - i);
                float* outptr = top_blob.row(i);

                memcpy(outptr, ptr, frames * sizeof(float));
            }
        }
    }

    return 0;
}